

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O3

void room_update(void)

{
  short sVar1;
  ROOM_INDEX_DATA *pRVar2;
  ROOM_AFFECT_DATA *pRVar3;
  ROOM_AFFECT_DATA *paf;
  ROOM_INDEX_DATA *room;
  
  pRVar2 = top_affected_room;
  do {
    room = pRVar2;
    if (room == (ROOM_INDEX_DATA *)0x0) {
      return;
    }
    pRVar2 = room->aff_next;
    pRVar3 = room->affected;
LAB_002c4a3f:
    while (paf = pRVar3, paf != (ROOM_AFFECT_DATA *)0x0) {
      pRVar3 = paf->next;
      sVar1 = paf->duration;
      if (sVar1 == 0) goto LAB_002c4a7b;
      if (paf->tick_fun != (RAFF_FUN *)0x0) {
        (*paf->tick_fun)(room,paf);
        sVar1 = paf->duration;
      }
      if (sVar1 < 1) goto LAB_002c4a79;
      paf->duration = sVar1 + -1;
    }
  } while( true );
LAB_002c4a79:
  if (-1 < sVar1) {
LAB_002c4a7b:
    affect_remove_room(room,paf);
  }
  goto LAB_002c4a3f;
}

Assistant:

void room_update(void)
{
	ROOM_INDEX_DATA *room;
	ROOM_INDEX_DATA *room_next;

	for (room = top_affected_room; room; room = room_next)
	{
		ROOM_AFFECT_DATA *paf;
		ROOM_AFFECT_DATA *paf_next;

		room_next = room->aff_next;

		for (paf = room->affected; paf != nullptr; paf = paf_next)
		{
			paf_next = paf->next;

			if (paf->duration != 0)
			{
				if (paf->tick_fun)
					(*paf->tick_fun)(room, paf);
			}

			if (paf->duration > 0)
				paf->duration--;
			else if (paf->duration < 0); //TODO: possible logic error
			else
				affect_remove_room(room, paf);
		}
	}
}